

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::CloneFrom
          (RuntimeCharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  uint uVar3;
  CharSet<char16_t> *this_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  CharSetInner *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CharSetNode *local_98;
  CharSetNode *newRoot;
  TrackAllocData local_50;
  uint local_28;
  uint local_24;
  uint k;
  uint i;
  CharSet<char16_t> *other_local;
  ArenaAllocator *allocator_local;
  RuntimeCharSet<char16_t> *this_local;
  
  _k = other;
  other_local = (CharSet<char16_t> *)allocator;
  allocator_local = (ArenaAllocator *)this;
  if (this->root != (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6e9,"(root == nullptr)","root == nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar5 = CharBitvec::Count(&this->direct);
  if (uVar5 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6ea,"(direct.Count() == 0)","direct.Count() == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar4 = CharSet<char16_t>::IsCompact(_k);
  if (bVar4) {
    for (local_24 = 0; uVar3 = local_24, uVar5 = CharSet<char16_t>::GetCompactLength(_k),
        uVar3 < uVar5; local_24 = local_24 + 1) {
      local_28 = CharSet<char16_t>::GetCompactCharU(_k,local_24);
      this_00 = other_local;
      if (local_28 < 0x100) {
        CharBitvec::Set(&this->direct,local_28);
      }
      else {
        if (this->root == (CharSetNode *)0x0) {
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_50,(type_info *)&CharSetInner::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                     ,0x6f5);
          alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)this_00,&local_50);
          this_01 = (CharSetInner *)
                    new<Memory::ArenaAllocator>(0x88,(ArenaAllocator *)alloc,0x3f67b0);
          CharSetInner::CharSetInner(this_01);
          this->root = (CharSetNode *)this_01;
        }
        iVar6 = (*this->root->_vptr_CharSetNode[2])
                          (this->root,other_local,2,(ulong)local_28,(ulong)local_28);
        if ((CharSetNode *)CONCAT44(extraout_var,iVar6) != this->root) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0x6fd,"(newRoot == root)","newRoot == root");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
  }
  else {
    if ((_k->rep).compact.countPlusOne == 0) {
      local_98 = (CharSetNode *)0x0;
    }
    else {
      pCVar1 = (_k->rep).full.root;
      iVar6 = (*pCVar1->_vptr_CharSetNode[1])(pCVar1,other_local);
      local_98 = (CharSetNode *)CONCAT44(extraout_var_00,iVar6);
    }
    this->root = local_98;
    CharBitvec::CloneFrom(&this->direct,&(_k->rep).full.direct);
  }
  return;
}

Assistant:

void RuntimeCharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Assert(root == nullptr);
        Assert(direct.Count() == 0);
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                uint k = other.GetCompactCharU(i);
                if (k < CharSetNode::directSize)
                    direct.Set(k);
                else
                {
                    if (root == nullptr)
                        root = Anew(allocator, CharSetInner);
#if DBG
                    CharSetNode* newRoot =
#endif
                    root->Set(allocator, CharSetNode::levels - 1, k, k);
#if DBG
                    // NOTE: Since we can add at most MaxCompact characters, we can never fill a leaf or inner node,
                    //       thus we will never need to reallocated nodes
                    Assert(newRoot == root);
#endif
                }
            }
        }
        else
        {
            root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            direct.CloneFrom(other.rep.full.direct);
        }
    }